

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void plan(int count)

{
  long lVar1;
  
  lVar1 = (long)level;
  level = level + 1;
  tests_done[lVar1 + 1] = 0;
  tests_failed[lVar1 + 1] = 0;
  plan_test[lVar1 + 1] = count;
  __space(_stdout);
  printf("%d..%d\n",1,(ulong)(uint)plan_test[level]);
  return;
}

Assistant:

void
plan(int count)
{
	++level;
	plan_test[level] = count;
	tests_done[level] = 0;
	tests_failed[level] = 0;

	__space(stdout);
	printf("%d..%d\n", 1, plan_test[level]);
}